

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_resume_data(nghttp2_session *session,int32_t stream_id)

{
  int iVar1;
  nghttp2_stream *stream_00;
  undefined4 in_ESI;
  nghttp2_stream *stream;
  int rv;
  uint8_t in_stack_ffffffffffffffdf;
  undefined8 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  stream_00 = nghttp2_session_get_stream
                        ((nghttp2_session *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                         (int32_t)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if ((stream_00 == (nghttp2_stream *)0x0) ||
     (iVar1 = nghttp2_stream_check_deferred_item(stream_00), iVar1 == 0)) {
    local_4 = -0x1f5;
  }
  else {
    local_4 = session_resume_deferred_stream_item
                        ((nghttp2_session *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),stream_00,
                         in_stack_ffffffffffffffdf);
    iVar1 = nghttp2_is_fatal(local_4);
    if (iVar1 == 0) {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int nghttp2_session_resume_data(nghttp2_session *session, int32_t stream_id) {
  int rv;
  nghttp2_stream *stream;
  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream == NULL || !nghttp2_stream_check_deferred_item(stream)) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  rv = session_resume_deferred_stream_item(session, stream,
                                           NGHTTP2_STREAM_FLAG_DEFERRED_USER);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  return 0;
}